

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

int cueify_device_open(cueify_device *d,char *device)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  
  iVar1 = 3;
  if (d != (cueify_device *)0x0) {
    if ((device == (char *)0x0) &&
       (device = cueify_device_get_default_device_unportable(), device == (char *)0x0)) {
      return 5;
    }
    if (*device != '\0') {
      *d = (cueify_device)0x0;
      d[1] = (cueify_device)0x0;
      sVar2 = strlen(device);
      __dest = (char *)malloc(sVar2 + 1);
      d[1] = __dest;
      if (__dest == (char *)0x0) {
        iVar1 = 4;
      }
      else {
        strcpy(__dest,device);
        iVar1 = cueify_device_open_unportable((cueify_device_private *)d,device);
        if (iVar1 != 0) {
          free(d[1]);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int cueify_device_open(cueify_device *d, const char *device) {
    cueify_device_private *dev = (cueify_device_private *)d;
    int retval = CUEIFY_OK;

    /* Must have a defined device instance */
    if (dev == NULL) {
	return CUEIFY_ERR_BADARG;
    }
    /* Get the default device if needed */
    if (device == NULL) {
	device = cueify_device_get_default_device();
	if (device == NULL) {
	    return CUEIFY_ERR_NO_DEVICE;
	}
    }
    /* The device should actually be something */
    if (device[0] == '\0') {
	return CUEIFY_ERR_BADARG;
    }

    memset(dev, 0, sizeof(cueify_device_private));
    dev->path = malloc(strlen(device) + 1);
    if (dev->path == NULL) {
	return CUEIFY_ERR_NOMEM;
    }
    strcpy(dev->path, device);

    retval = cueify_device_open_unportable(dev, device);
    if (retval != CUEIFY_OK) {
	free(dev->path);
    }
    return retval;
}